

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

int_fast64_t
absl::lts_20250127::time_internal::cctz::anon_unknown_0::TransOffset
          (bool leap_year,int jan1_weekday,PosixTransition *pt)

{
  DateFormat DVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  int_fast64_t weekday;
  anon_union_8_3_4e90bb4b_for_Date_1 aStack_20;
  bool last_week;
  int_fast64_t days;
  PosixTransition *pt_local;
  int jan1_weekday_local;
  bool leap_year_local;
  
  aStack_20 = (anon_union_8_3_4e90bb4b_for_Date_1)0x0;
  DVar1 = (pt->date).fmt;
  if (DVar1 == J) {
    aStack_20 = *(anon_union_8_3_4e90bb4b_for_Date_1 *)&(pt->date).field_1.m;
    if ((!leap_year) || ((long)aStack_20 < 0x3c)) {
      aStack_20 = (anon_union_8_3_4e90bb4b_for_Date_1)((long)aStack_20 + -1);
    }
  }
  else if (DVar1 == N) {
    aStack_20 = (pt->date).field_1;
  }
  else if (DVar1 == M) {
    bVar4 = (pt->date).field_1.m.week == '\x05';
    lVar2 = (long)*(short *)(cctz::(anonymous_namespace)::kMonthOffsets +
                            (long)(int)((int)(pt->date).field_1.m.month + (uint)bVar4) * 2 +
                            (ulong)leap_year * 0x1c);
    lVar3 = (jan1_weekday + lVar2) % 7;
    if (bVar4) {
      aStack_20 = (anon_union_8_3_4e90bb4b_for_Date_1)
                  (lVar2 - (((lVar3 + 6) - (long)(pt->date).field_1.m.weekday) % 7 + 1));
    }
    else {
      aStack_20 = (anon_union_8_3_4e90bb4b_for_Date_1)
                  ((long)(((pt->date).field_1.m.week + -1) * 7) +
                  (((pt->date).field_1.m.weekday + 7) - lVar3) % 7 + lVar2);
    }
  }
  return (long)aStack_20 * 0x15180 + (pt->time).offset;
}

Assistant:

std::int_fast64_t TransOffset(bool leap_year, int jan1_weekday,
                              const PosixTransition& pt) {
  std::int_fast64_t days = 0;
  switch (pt.date.fmt) {
    case PosixTransition::J: {
      days = pt.date.j.day;
      if (!leap_year || days < kMonthOffsets[1][3]) days -= 1;
      break;
    }
    case PosixTransition::N: {
      days = pt.date.n.day;
      break;
    }
    case PosixTransition::M: {
      const bool last_week = (pt.date.m.week == 5);
      days = kMonthOffsets[leap_year][pt.date.m.month + last_week];
      const std::int_fast64_t weekday = (jan1_weekday + days) % 7;
      if (last_week) {
        days -= (weekday + 7 - 1 - pt.date.m.weekday) % 7 + 1;
      } else {
        days += (pt.date.m.weekday + 7 - weekday) % 7;
        days += (pt.date.m.week - 1) * 7;
      }
      break;
    }
  }
  return (days * kSecsPerDay) + pt.time.offset;
}